

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsTest.cpp
# Opt level: O2

void Generate(mt19937 *rng,vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer)

{
  pointer puVar1;
  result_type rVar2;
  uint uVar3;
  bool bVar4;
  result_type_conflict1 rVar5;
  uniform_int_distribution<unsigned_int> ud;
  uchar local_39;
  uniform_real_distribution<double> local_38;
  
  local_38._M_param._M_a = 0.0;
  local_38._M_param._M_b = 1.0;
  rVar5 = std::uniform_real_distribution<double>::operator()(&local_38,rng);
  uVar3 = (int)(long)(rVar5 * rVar5 * rVar5 * 4194303.0) + 1;
  puVar1 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(buffer,(ulong)uVar3);
  local_38._M_param._M_a = 5.41108926696144e-312;
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)&local_38,rng);
    local_39 = (uchar)rVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (buffer,&local_39);
  }
  return;
}

Assistant:

static void Generate(std::mt19937 & rng, std::vector<uint8_t> & buffer)
{
	// Fill up a test buffer of random size with random data. 
	auto rndVal = std::uniform_real_distribution<double>(0.0, 1.0f)(rng);
	auto size = static_cast<uint32_t>((rndVal * rndVal * rndVal) * (MAX_PAYLOAD_SIZE - MIN_PAYLOAD_SIZE)) + MIN_PAYLOAD_SIZE;
	buffer.clear();
	buffer.reserve(size);
	auto ud = std::uniform_int_distribution<uint32_t>(0, 255);
	for (uint32_t i = 0; i < size; ++i)
		buffer.push_back(static_cast<uint8_t>(ud(rng)));
}